

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::RepeatedEnumFieldGenerator::GenerateMergingCode
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "int length = com.google.protobuf.nano.WireFormatNano\n    .getRepeatedFieldArrayLength(input, $non_packed_tag$);\nint[] validValues = new int[length];\nint validCount = 0;\nfor (int i = 0; i < length; i++) {\n  if (i != 0) { // tag for first value already consumed.\n    input.readTag();\n  }\n  int value = input.readInt32();\n  switch (value) {\n"
                    );
  io::Printer::Indent(printer);
  anon_unknown_3::PrintCaseLabels(printer,&this->canonical_values_);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,&this->variables_,
                     "      validValues[validCount++] = value;\n      break;\n  }\n}\nif (validCount != 0) {\n  int i = this.$name$ == null ? 0 : this.$name$.length;\n  if (i == 0 && validCount == validValues.length) {\n    this.$name$ = validValues;\n  } else {\n    int[] newArray = new int[i + validCount];\n    if (i != 0) {\n      java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n    }\n    java.lang.System.arraycopy(validValues, 0, newArray, i, validCount);\n    this.$name$ = newArray;\n  }\n}\n"
                    );
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  // First, figure out the maximum length of the array, then parse,
  // and finally copy the valid values to the field.
  printer->Print(variables_,
    "int length = com.google.protobuf.nano.WireFormatNano\n"
    "    .getRepeatedFieldArrayLength(input, $non_packed_tag$);\n"
    "int[] validValues = new int[length];\n"
    "int validCount = 0;\n"
    "for (int i = 0; i < length; i++) {\n"
    "  if (i != 0) { // tag for first value already consumed.\n"
    "    input.readTag();\n"
    "  }\n"
    "  int value = input.readInt32();\n"
    "  switch (value) {\n");
  printer->Indent();
  PrintCaseLabels(printer, canonical_values_);
  printer->Outdent();
  printer->Print(variables_,
    "      validValues[validCount++] = value;\n"
    "      break;\n"
    "  }\n"
    "}\n"
    "if (validCount != 0) {\n"
    "  int i = this.$name$ == null ? 0 : this.$name$.length;\n"
    "  if (i == 0 && validCount == validValues.length) {\n"
    "    this.$name$ = validValues;\n"
    "  } else {\n"
    "    int[] newArray = new int[i + validCount];\n"
    "    if (i != 0) {\n"
    "      java.lang.System.arraycopy(this.$name$, 0, newArray, 0, i);\n"
    "    }\n"
    "    java.lang.System.arraycopy(validValues, 0, newArray, i, validCount);\n"
    "    this.$name$ = newArray;\n"
    "  }\n"
    "}\n");
}